

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O3

void __thiscall
icu_63::ReorderingBuffer::copyReorderableSuffixTo(ReorderingBuffer *this,UnicodeString *s)

{
  short sVar1;
  UChar *srcChars;
  UChar *pUVar2;
  int32_t length;
  
  srcChars = this->reorderStart;
  pUVar2 = this->limit;
  icu_63::UnicodeString::unBogus(s);
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    length = (s->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar1 >> 5;
  }
  icu_63::UnicodeString::doReplace
            (s,0,length,srcChars,0,(int32_t)((ulong)((long)pUVar2 - (long)srcChars) >> 1));
  return;
}

Assistant:

void copyReorderableSuffixTo(UnicodeString &s) const {
        s.setTo(ConstChar16Ptr(reorderStart), (int32_t)(limit-reorderStart));
    }